

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::MultipleConcatenationExpressionSyntax::setChild
          (MultipleConcatenationExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0041a5f8 + *(int *)(&DAT_0041a5f8 + index * 4)))();
  return;
}

Assistant:

void MultipleConcatenationExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: expression = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: concatenation = child.node() ? &child.node()->as<ConcatenationExpressionSyntax>() : nullptr; return;
        case 3: closeBrace = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}